

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_node_list_around
          (REF_CELL ref_cell,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  int *piVar1;
  int iVar2;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  int iVar5;
  ulong uVar6;
  REF_INT RVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  *nnode = 0;
  uVar6 = 0xffffffff;
  RVar7 = -1;
  if (-1 < node) {
    pRVar3 = ref_cell->ref_adj;
    uVar6 = 0xffffffff;
    RVar7 = -1;
    if (node < pRVar3->nnode) {
      uVar8 = pRVar3->first[(uint)node];
      uVar6 = 0xffffffff;
      RVar7 = -1;
      if ((long)(int)uVar8 != -1) {
        RVar7 = pRVar3->item[(int)uVar8].ref;
        uVar6 = (ulong)uVar8;
      }
    }
  }
  uVar8 = 0;
  do {
    if ((int)uVar6 == -1) {
      return 0;
    }
    for (iVar5 = 0; iVar5 < ref_cell->node_per; iVar5 = iVar5 + 1) {
      iVar2 = ref_cell->c2n[ref_cell->size_per * RVar7 + iVar5];
      if (iVar2 != node) {
        uVar10 = 0;
        if (0 < (int)uVar8) {
          uVar10 = (ulong)uVar8;
        }
        uVar9 = 0;
        do {
          if (uVar10 == uVar9) {
            if (max_node <= (int)uVar8) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x4e8,"ref_cell_node_list_around",7,"max_node too small");
              return 7;
            }
            node_list[(int)uVar8] = iVar2;
            uVar8 = *nnode + 1;
            *nnode = uVar8;
            break;
          }
          piVar1 = node_list + uVar9;
          uVar9 = uVar9 + 1;
        } while (*piVar1 != iVar2);
      }
    }
    pRVar4 = ref_cell->ref_adj->item;
    uVar6 = (ulong)pRVar4[(int)uVar6].next;
    RVar7 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      RVar7 = pRVar4[uVar6].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_node_list_around(REF_CELL ref_cell, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
      already_have_it = REF_FALSE;
      for (haves = 0; haves < *nnode; haves++)
        if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
          already_have_it = REF_TRUE;
          break;
        }
      if (!already_have_it) {
        if (*nnode >= max_node) {
          RSS(REF_INCREASE_LIMIT, "max_node too small");
        }
        node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
        (*nnode)++;
      }
    }
  }

  return REF_SUCCESS;
}